

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int lyxp_eval(char *expr,lyd_node *cur_node,lyxp_node_type cur_node_type,lys_module *param_4,
             lyxp_set *set,int options)

{
  ly_ctx *ctx;
  int iVar1;
  int iVar2;
  lyxp_expr *exp;
  uint uVar3;
  uint16_t local_32 [4];
  uint16_t exp_idx;
  
  local_32[0] = 0;
  if ((param_4 == (lys_module *)0x0 || expr == (char *)0x0) || set == (lyxp_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyxp_eval");
    iVar2 = 1;
  }
  else {
    ctx = param_4->ctx;
    exp = lyxp_parse_expr(ctx,expr);
    iVar2 = -1;
    if (exp != (lyxp_expr *)0x0) {
      iVar1 = reparse_or_expr(ctx,exp,local_32);
      if (iVar1 == 0) {
        if (local_32[0] < exp->used) {
          uVar3 = (uint)local_32[0];
          ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
                  exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar3 * 2)));
          iVar2 = -1;
          ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                  "Unparsed characters \"%s\" left at the end of an XPath expression.",
                  exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar3 * 2)));
        }
        else {
          print_expr_struct_debug(exp);
          local_32[0] = 0;
          set->ctx_pos = 0;
          set->ctx_size = 0;
          *(undefined8 *)&set->field_0x38 = 0;
          set->used = 0;
          set->size = 0;
          set->ht = (hash_table *)0x0;
          (set->val).nodes = (lyxp_set_node *)0x0;
          *(undefined8 *)((long)&set->val + 8) = 0;
          *(undefined8 *)set = 0;
          *(undefined8 *)&set->field_0x8 = 0;
          if (cur_node == (lyd_node *)0x0) {
            iVar2 = eval_expr_select(exp,local_32,LYXP_EXPR_NONE,(lyd_node *)0x0,param_4,set,options
                                    );
            if (iVar2 == 2) {
              iVar2 = 0;
            }
          }
          else {
            set_insert_node(set,cur_node,0,cur_node_type,0);
            iVar2 = eval_expr_select(exp,local_32,LYXP_EXPR_NONE,cur_node,param_4,set,options);
            if (iVar2 == 2) {
              iVar2 = 0;
            }
            if (iVar2 == -1) {
              ly_vlog(ctx,LYE_PATH,LY_VLOG_LYD,cur_node);
              lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,param_4,options);
              iVar2 = -1;
            }
          }
        }
      }
    }
    lyxp_expr_free(exp);
  }
  return iVar2;
}

Assistant:

int
lyxp_eval(const char *expr, const struct lyd_node *cur_node, enum lyxp_node_type cur_node_type,
          const struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    struct ly_ctx *ctx;
    struct lyxp_expr *exp;
    uint16_t exp_idx = 0;
    int rc = -1;

    if (!expr || !local_mod || !set) {
        LOGARG;
        return EXIT_FAILURE;
    }

    ctx = local_mod->ctx;

    exp = lyxp_parse_expr(ctx, expr);
    if (!exp) {
        rc = -1;
        goto finish;
    }

    rc = reparse_or_expr(ctx, exp, &exp_idx);
    if (rc) {
        goto finish;
    } else if (exp->used > exp_idx) {
        LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[exp_idx]]);
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Unparsed characters \"%s\" left at the end of an XPath expression.",
               &exp->expr[exp->expr_pos[exp_idx]]);
        rc = -1;
        goto finish;
    }

    print_expr_struct_debug(exp);

    exp_idx = 0;
    memset(set, 0, sizeof *set);
    set->type = LYXP_SET_EMPTY;
    if (cur_node) {
        set_insert_node(set, (struct lyd_node *)cur_node, 0, cur_node_type, 0);
    }

    rc = eval_expr_select(exp, &exp_idx, 0, (struct lyd_node *)cur_node, (struct lys_module *)local_mod, set, options);
    if (rc == 2) {
        rc = EXIT_SUCCESS;
    }
    if ((rc == -1) && cur_node) {
        LOGPATH(ctx, LY_VLOG_LYD, cur_node);
        lyxp_set_cast(set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    }

finish:
    lyxp_expr_free(exp);
    return rc;
}